

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O2

void co_yield_ct(void)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)__tls_get_addr(&PTR_0010afa8);
  co_yield_env((stCoRoutineEnv_t *)*puVar1);
  return;
}

Assistant:

void co_yield_ct()
{

	co_yield_env( co_get_curr_thread_env() );
}